

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::getShaderStages
          (FunctionalTest16 *this,bool retrieve_program_object_shader_ids,uint *n_id,
          _shader_stage **out_shader_stages)

{
  _shader_stage **out_shader_stages_local;
  uint *n_id_local;
  bool retrieve_program_object_shader_ids_local;
  FunctionalTest16 *this_local;
  
  if (retrieve_program_object_shader_ids) {
    *out_shader_stages = &this->m_po_descriptors[*n_id].vertex;
    out_shader_stages[1] = &this->m_po_descriptors[*n_id].tess_control;
    out_shader_stages[2] = &this->m_po_descriptors[*n_id].tess_evaluation;
    out_shader_stages[3] = &this->m_po_descriptors[*n_id].geometry;
    out_shader_stages[4] = &this->m_po_descriptors[*n_id].fragment;
  }
  else {
    *out_shader_stages = this->m_vs_po_descriptors + *n_id;
    out_shader_stages[1] = this->m_tc_po_descriptors + *n_id;
    out_shader_stages[2] = this->m_te_po_descriptors + *n_id;
    out_shader_stages[3] = this->m_gs_po_descriptors + *n_id;
    out_shader_stages[4] = this->m_fs_po_descriptors + *n_id;
  }
  return;
}

Assistant:

void FunctionalTest16::getShaderStages(bool retrieve_program_object_shader_ids, const unsigned int& n_id,
									   const _shader_stage** out_shader_stages) const
{
	if (retrieve_program_object_shader_ids)
	{
		out_shader_stages[0] = &m_po_descriptors[n_id].vertex;
		out_shader_stages[1] = &m_po_descriptors[n_id].tess_control;
		out_shader_stages[2] = &m_po_descriptors[n_id].tess_evaluation;
		out_shader_stages[3] = &m_po_descriptors[n_id].geometry;
		out_shader_stages[4] = &m_po_descriptors[n_id].fragment;
	}
	else
	{
		out_shader_stages[0] = m_vs_po_descriptors + n_id;
		out_shader_stages[1] = m_tc_po_descriptors + n_id;
		out_shader_stages[2] = m_te_po_descriptors + n_id;
		out_shader_stages[3] = m_gs_po_descriptors + n_id;
		out_shader_stages[4] = m_fs_po_descriptors + n_id;
	}
}